

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O0

void __thiscall Writer::writeBlock(Writer *this,Block *block)

{
  bool bVar1;
  long in_RSI;
  __normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *in_RDI;
  Expr **expr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range1;
  StrRef in_stack_ffffffffffffff78;
  __normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
  *in_stack_ffffffffffffff80;
  allocator *in_stack_ffffffffffffff88;
  __normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> *p_Var2;
  allocator local_51;
  string local_50 [32];
  reference local_30;
  Expr **local_28;
  __normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  CWriter::indent((CWriter *)in_RDI,(size_t)in_stack_ffffffffffffff88);
  CWriter::startBlock((CWriter *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_18 = local_10 + 0x10;
  local_20._M_current =
       (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                          ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff78);
  local_28 = (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::end
                                ((vector<Expr_*,_std::allocator<Expr_*>_> *)
                                 in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
               operator*(&local_20);
    CWriter::indent((CWriter *)in_RDI,(size_t)in_stack_ffffffffffffff88);
    (*(*local_30)->_vptr_Expr[2])(*local_30,in_RDI + 1);
    bVar1 = llvm::isa<IfExpr,Expr*>((Expr **)0x2ac571);
    p_Var2 = in_RDI;
    if (!bVar1) {
      bVar1 = llvm::isa<SwitchExpr,Expr*>((Expr **)0x2ac583);
      p_Var2 = in_RDI;
      if (!bVar1) {
        bVar1 = llvm::isa<ExprList,Expr*>((Expr **)0x2ac595);
        p_Var2 = in_RDI;
        if (!bVar1) {
          in_stack_ffffffffffffff88 = &local_51;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_50,";",in_stack_ffffffffffffff88);
          CWriter::line((CWriter *)in_RDI,in_stack_ffffffffffffff78);
          std::__cxx11::string::~string(local_50);
          std::allocator<char>::~allocator((allocator<char> *)&local_51);
          in_stack_ffffffffffffff80 = in_RDI;
        }
      }
    }
    __gnu_cxx::__normal_iterator<Expr_*const_*,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
    operator++(&local_20);
    in_RDI = p_Var2;
  }
  return;
}

Assistant:

void Writer::writeBlock(const Block* block) {
    wr.indent(1);
    wr.startBlock(block->blockName);

    for (const auto& expr : block->expressions) {
        wr.indent(1);
        expr->accept(ew);
        if (!llvm::isa<IfExpr>(expr) && !llvm::isa<SwitchExpr>(expr) && !llvm::isa<ExprList>(expr)) {
            wr.line(";");
        }
    }
}